

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<int> wasm::WATParser::anon_unknown_0::getHexDigit(char c)

{
  int local_20;
  int local_1c;
  int local_18;
  char local_11;
  _Optional_payload_base<int> _Stack_10;
  char c_local;
  
  local_11 = c;
  if ((c < '0') || ('9' < c)) {
    if ((c < 'A') || ('F' < c)) {
      if ((c < 'a') || ('f' < c)) {
        std::optional<int>::optional((optional<int> *)&stack0xfffffffffffffff0);
      }
      else {
        local_20 = c + -0x57;
        std::optional<int>::optional<int,_true>((optional<int> *)&stack0xfffffffffffffff0,&local_20)
        ;
      }
    }
    else {
      local_1c = c + -0x37;
      std::optional<int>::optional<int,_true>((optional<int> *)&stack0xfffffffffffffff0,&local_1c);
    }
  }
  else {
    local_18 = c + -0x30;
    std::optional<int>::optional<int,_true>((optional<int> *)&stack0xfffffffffffffff0,&local_18);
  }
  return (optional<int>)_Stack_10;
}

Assistant:

std::optional<int> getHexDigit(char c) {
  if ('0' <= c && c <= '9') {
    return c - '0';
  }
  if ('A' <= c && c <= 'F') {
    return 10 + c - 'A';
  }
  if ('a' <= c && c <= 'f') {
    return 10 + c - 'a';
  }
  return {};
}